

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O1

Options * __thiscall S2Builder::Options::operator=(Options *this,Options *options)

{
  _Head_base<0UL,_S2Builder::SnapFunction_*,_false> _Var1;
  _Head_base<0UL,_S2Builder::SnapFunction_*,_false> _Var2;
  _Head_base<0UL,_S2Builder::SnapFunction_*,_false> local_20;
  
  (*((options->snap_function_)._M_t.
     super___uniq_ptr_impl<S2Builder::SnapFunction,_std::default_delete<S2Builder::SnapFunction>_>.
     _M_t.
     super__Tuple_impl<0UL,_S2Builder::SnapFunction_*,_std::default_delete<S2Builder::SnapFunction>_>
     .super__Head_base<0UL,_S2Builder::SnapFunction_*,_false>._M_head_impl)->_vptr_SnapFunction[6])
            (&local_20);
  _Var2._M_head_impl = local_20._M_head_impl;
  local_20._M_head_impl = (SnapFunction *)0x0;
  _Var1._M_head_impl =
       (this->snap_function_)._M_t.
       super___uniq_ptr_impl<S2Builder::SnapFunction,_std::default_delete<S2Builder::SnapFunction>_>
       ._M_t.
       super__Tuple_impl<0UL,_S2Builder::SnapFunction_*,_std::default_delete<S2Builder::SnapFunction>_>
       .super__Head_base<0UL,_S2Builder::SnapFunction_*,_false>._M_head_impl;
  (this->snap_function_)._M_t.
  super___uniq_ptr_impl<S2Builder::SnapFunction,_std::default_delete<S2Builder::SnapFunction>_>._M_t
  .super__Tuple_impl<0UL,_S2Builder::SnapFunction_*,_std::default_delete<S2Builder::SnapFunction>_>.
  super__Head_base<0UL,_S2Builder::SnapFunction_*,_false>._M_head_impl = _Var2._M_head_impl;
  if (_Var1._M_head_impl != (SnapFunction *)0x0) {
    (*(_Var1._M_head_impl)->_vptr_SnapFunction[1])();
  }
  if (local_20._M_head_impl != (SnapFunction *)0x0) {
    (*(local_20._M_head_impl)->_vptr_SnapFunction[1])();
  }
  this->split_crossing_edges_ = options->split_crossing_edges_;
  this->simplify_edge_chains_ = options->simplify_edge_chains_;
  this->idempotent_ = options->idempotent_;
  return this;
}

Assistant:

S2Builder::Options& S2Builder::Options::operator=(const Options& options) {
  snap_function_ = options.snap_function_->Clone();
  split_crossing_edges_ = options.split_crossing_edges_;
  simplify_edge_chains_ = options.simplify_edge_chains_;
  idempotent_ = options.idempotent_;
  return *this;
}